

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm_sse2.c
# Opt level: O3

void av1_lowbd_fwd_txfm2d_16x64_sse2
               (int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  undefined8 *puVar1;
  short *psVar2;
  int32_t *piVar3;
  undefined4 *puVar4;
  byte bVar5;
  undefined2 uVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  undefined8 uVar11;
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  int8_t *piVar17;
  bool bVar18;
  int16_t *piVar19;
  long lVar20;
  long lVar21;
  int32_t *piVar22;
  bool bVar23;
  longlong *plVar24;
  undefined4 uVar25;
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  undefined4 uVar30;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar42 [16];
  undefined4 uVar46;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar54 [16];
  undefined4 uVar55;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  __m128i buf0 [64];
  __m128i buf1 [128];
  longlong local_c38 [2];
  undefined2 auStack_c28 [8];
  undefined1 auStack_c18 [16];
  undefined2 auStack_c08 [8];
  undefined1 auStack_bf8 [16];
  undefined2 auStack_be8 [8];
  undefined1 auStack_bd8 [16];
  undefined2 auStack_bc8 [456];
  longlong local_838 [16];
  longlong local_7b8 [241];
  undefined1 auVar26 [12];
  undefined1 auVar28 [16];
  undefined1 auVar31 [12];
  undefined1 auVar35 [16];
  undefined1 auVar32 [16];
  undefined1 auVar36 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar47 [12];
  undefined1 auVar48 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar56 [12];
  undefined1 auVar57 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  
  piVar17 = av1_fwd_txfm_shift_ls[0x11];
  plVar24 = local_838;
  lVar21 = 0;
  bVar18 = true;
  do {
    bVar23 = bVar18;
    piVar19 = input + lVar21;
    lVar21 = 0;
    do {
      uVar11 = *(undefined8 *)(piVar19 + 4);
      *(undefined8 *)((long)local_c38 + lVar21) = *(undefined8 *)piVar19;
      *(undefined8 *)((long)auStack_c28 + lVar21 + -8) = uVar11;
      lVar21 = lVar21 + 0x10;
      piVar19 = piVar19 + stride;
    } while (lVar21 != 0x400);
    bVar5 = *piVar17;
    if ((char)bVar5 < '\0') {
      auVar27 = ZEXT416((uint)(1 << (~bVar5 & 0x1f)));
      auVar27 = pshuflw(auVar27,auVar27,0);
      auVar27._4_4_ = auVar27._0_4_;
      auVar27._8_4_ = auVar27._0_4_;
      auVar27._12_4_ = auVar27._0_4_;
      lVar21 = 0;
      do {
        auVar37 = paddsw(*(undefined1 (*) [16])((long)local_c38 + lVar21),auVar27);
        auVar37 = psraw(auVar37,ZEXT416((uint)-(int)(char)bVar5));
        *(undefined1 (*) [16])((long)local_c38 + lVar21) = auVar37;
        lVar21 = lVar21 + 0x10;
      } while (lVar21 != 0x400);
    }
    else if (bVar5 != 0) {
      lVar21 = 0;
      do {
        auVar27 = psllw(*(undefined1 (*) [16])((long)local_c38 + lVar21),
                        ZEXT416((uint)(int)(char)bVar5));
        *(undefined1 (*) [16])((long)local_c38 + lVar21) = auVar27;
        lVar21 = lVar21 + 0x10;
      } while (lVar21 != 0x400);
    }
    av1_fdct8x64_new_sse2(&local_c38,&local_c38,'\r');
    bVar5 = piVar17[1];
    if ((char)bVar5 < '\0') {
      auVar27 = ZEXT416((uint)(1 << (~bVar5 & 0x1f)));
      auVar27 = pshuflw(auVar27,auVar27,0);
      auVar37._0_4_ = auVar27._0_4_;
      auVar37._4_4_ = auVar37._0_4_;
      auVar37._8_4_ = auVar37._0_4_;
      auVar37._12_4_ = auVar37._0_4_;
      lVar21 = 0;
      do {
        auVar27 = paddsw(*(undefined1 (*) [16])((long)local_c38 + lVar21),auVar37);
        auVar27 = psraw(auVar27,ZEXT416((uint)-(int)(char)bVar5));
        *(undefined1 (*) [16])((long)local_c38 + lVar21) = auVar27;
        lVar21 = lVar21 + 0x10;
      } while (lVar21 != 0x400);
    }
    else if (bVar5 != 0) {
      lVar21 = 0;
      do {
        auVar27 = psllw(*(undefined1 (*) [16])((long)local_c38 + lVar21),
                        ZEXT416((uint)(int)(char)bVar5));
        *(undefined1 (*) [16])((long)local_c38 + lVar21) = auVar27;
        lVar21 = lVar21 + 0x10;
      } while (lVar21 != 0x400);
    }
    lVar21 = 0;
    do {
      auVar27 = *(undefined1 (*) [16])((long)local_c38 + lVar21);
      auVar37 = *(undefined1 (*) [16])((long)auStack_c28 + lVar21 + 0x10);
      auVar41._0_12_ = auVar27._0_12_;
      auVar41._12_2_ = auVar27._6_2_;
      auVar41._14_2_ = *(undefined2 *)((long)auStack_c28 + lVar21 + 6);
      auVar40._12_4_ = auVar41._12_4_;
      auVar40._0_10_ = auVar27._0_10_;
      auVar40._10_2_ = *(undefined2 *)((long)auStack_c28 + lVar21 + 4);
      auVar39._10_6_ = auVar40._10_6_;
      auVar39._0_8_ = auVar27._0_8_;
      auVar39._8_2_ = auVar27._4_2_;
      auVar12._4_8_ = auVar39._8_8_;
      auVar12._2_2_ = *(undefined2 *)((long)auStack_c28 + lVar21 + 2);
      auVar12._0_2_ = auVar27._2_2_;
      auVar38._0_4_ = CONCAT22(*(undefined2 *)((long)auStack_c28 + lVar21),auVar27._0_2_);
      auVar38._4_12_ = auVar12;
      auVar53._0_12_ = auVar37._0_12_;
      auVar53._12_2_ = auVar37._6_2_;
      auVar53._14_2_ = *(undefined2 *)((long)auStack_c08 + lVar21 + 6);
      auVar52._12_4_ = auVar53._12_4_;
      auVar52._0_10_ = auVar37._0_10_;
      auVar52._10_2_ = *(undefined2 *)((long)auStack_c08 + lVar21 + 4);
      auVar51._10_6_ = auVar52._10_6_;
      auVar51._0_8_ = auVar37._0_8_;
      auVar51._8_2_ = auVar37._4_2_;
      auVar13._4_8_ = auVar51._8_8_;
      auVar13._2_2_ = *(undefined2 *)((long)auStack_c08 + lVar21 + 2);
      auVar13._0_2_ = auVar37._2_2_;
      auVar32 = *(undefined1 (*) [16])((long)auStack_c08 + lVar21 + 0x10);
      auVar45._0_12_ = auVar32._0_12_;
      auVar45._12_2_ = auVar32._6_2_;
      auVar45._14_2_ = *(undefined2 *)((long)auStack_be8 + lVar21 + 6);
      auVar44._12_4_ = auVar45._12_4_;
      auVar44._0_10_ = auVar32._0_10_;
      auVar44._10_2_ = *(undefined2 *)((long)auStack_be8 + lVar21 + 4);
      auVar43._10_6_ = auVar44._10_6_;
      auVar43._0_8_ = auVar32._0_8_;
      auVar43._8_2_ = auVar32._4_2_;
      auVar14._4_8_ = auVar43._8_8_;
      auVar14._2_2_ = *(undefined2 *)((long)auStack_be8 + lVar21 + 2);
      auVar14._0_2_ = auVar32._2_2_;
      auVar42._0_4_ = CONCAT22(*(undefined2 *)((long)auStack_be8 + lVar21),auVar32._0_2_);
      auVar42._4_12_ = auVar14;
      auVar41 = *(undefined1 (*) [16])((long)auStack_be8 + lVar21 + 0x10);
      uVar6 = *(undefined2 *)((long)auStack_bc8 + lVar21);
      auVar61._0_12_ = auVar41._0_12_;
      auVar61._12_2_ = auVar41._6_2_;
      auVar61._14_2_ = *(undefined2 *)((long)auStack_bc8 + lVar21 + 6);
      auVar60._12_4_ = auVar61._12_4_;
      auVar60._0_10_ = auVar41._0_10_;
      auVar60._10_2_ = *(undefined2 *)((long)auStack_bc8 + lVar21 + 4);
      auVar59._10_6_ = auVar60._10_6_;
      auVar59._0_8_ = auVar41._0_8_;
      auVar59._8_2_ = auVar41._4_2_;
      auVar15._4_8_ = auVar59._8_8_;
      auVar15._2_2_ = *(undefined2 *)((long)auStack_bc8 + lVar21 + 2);
      auVar15._0_2_ = auVar41._2_2_;
      uVar25 = CONCAT22(*(undefined2 *)((long)auStack_c28 + lVar21 + 8),auVar27._8_2_);
      auVar26._0_8_ =
           CONCAT26(*(undefined2 *)((long)auStack_c28 + lVar21 + 10),CONCAT24(auVar27._10_2_,uVar25)
                   );
      auVar26._8_2_ = auVar27._12_2_;
      auVar26._10_2_ = *(undefined2 *)((long)auStack_c28 + lVar21 + 0xc);
      auVar28._12_2_ = auVar27._14_2_;
      auVar28._0_12_ = auVar26;
      auVar28._14_2_ = *(undefined2 *)((long)auStack_c28 + lVar21 + 0xe);
      uVar46 = CONCAT22(*(undefined2 *)((long)auStack_c08 + lVar21 + 8),auVar37._8_2_);
      auVar47._0_8_ =
           CONCAT26(*(undefined2 *)((long)auStack_c08 + lVar21 + 10),CONCAT24(auVar37._10_2_,uVar46)
                   );
      auVar47._8_2_ = auVar37._12_2_;
      auVar47._10_2_ = *(undefined2 *)((long)auStack_c08 + lVar21 + 0xc);
      auVar48._12_2_ = auVar37._14_2_;
      auVar48._0_12_ = auVar47;
      auVar48._14_2_ = *(undefined2 *)((long)auStack_c08 + lVar21 + 0xe);
      uVar30 = CONCAT22(*(undefined2 *)((long)auStack_be8 + lVar21 + 8),auVar32._8_2_);
      auVar31._0_8_ =
           CONCAT26(*(undefined2 *)((long)auStack_be8 + lVar21 + 10),CONCAT24(auVar32._10_2_,uVar30)
                   );
      auVar31._8_2_ = auVar32._12_2_;
      auVar31._10_2_ = *(undefined2 *)((long)auStack_be8 + lVar21 + 0xc);
      auVar32._12_2_ = auVar32._14_2_;
      auVar32._0_12_ = auVar31;
      auVar32._14_2_ = *(undefined2 *)((long)auStack_be8 + lVar21 + 0xe);
      uVar55 = CONCAT22(*(undefined2 *)((long)auStack_bc8 + lVar21 + 8),auVar41._8_2_);
      auVar56._0_8_ =
           CONCAT26(*(undefined2 *)((long)auStack_bc8 + lVar21 + 10),CONCAT24(auVar41._10_2_,uVar55)
                   );
      auVar56._8_2_ = auVar41._12_2_;
      auVar56._10_2_ = *(undefined2 *)((long)auStack_bc8 + lVar21 + 0xc);
      auVar57._12_2_ = auVar41._14_2_;
      auVar57._0_12_ = auVar56;
      auVar57._14_2_ = *(undefined2 *)((long)auStack_bc8 + lVar21 + 0xe);
      auVar49._0_8_ = auVar38._0_8_;
      auVar49._8_4_ = auVar12._0_4_;
      auVar49._12_4_ = auVar13._0_4_;
      auVar50._0_8_ = auVar42._0_8_;
      auVar50._8_4_ = auVar14._0_4_;
      auVar50._12_4_ = auVar15._0_4_;
      auVar54._8_4_ = (int)((ulong)auVar26._0_8_ >> 0x20);
      auVar54._0_8_ = auVar26._0_8_;
      auVar54._12_4_ = (int)((ulong)auVar47._0_8_ >> 0x20);
      auVar58._8_4_ = (int)((ulong)auVar31._0_8_ >> 0x20);
      auVar58._0_8_ = auVar31._0_8_;
      auVar58._12_4_ = (int)((ulong)auVar56._0_8_ >> 0x20);
      auVar33._0_8_ = CONCAT44(auVar56._8_4_,auVar31._8_4_);
      auVar33._8_4_ = auVar32._12_4_;
      auVar33._12_4_ = auVar57._12_4_;
      puVar1 = (undefined8 *)((long)plVar24 + lVar21 * 2);
      *puVar1 = CONCAT44(CONCAT22(*(undefined2 *)((long)auStack_c08 + lVar21),auVar37._0_2_),
                         auVar38._0_4_);
      puVar1[1] = CONCAT44(CONCAT22(uVar6,auVar41._0_2_),auVar42._0_4_);
      puVar1 = (undefined8 *)((long)plVar24 + lVar21 * 2 + 0x10);
      *puVar1 = auVar49._8_8_;
      puVar1[1] = auVar50._8_8_;
      puVar4 = (undefined4 *)((long)plVar24 + lVar21 * 2 + 0x20);
      *puVar4 = auVar39._8_4_;
      puVar4[1] = auVar51._8_4_;
      puVar4[2] = auVar43._8_4_;
      puVar4[3] = auVar59._8_4_;
      lVar20 = lVar21 * 2;
      *(undefined4 *)((long)plVar24 + lVar20 + 0x38) = auVar40._12_4_;
      *(undefined4 *)((long)plVar24 + lVar20 + 0x3c) = auVar52._12_4_;
      *(undefined4 *)((long)plVar24 + lVar20 + 0x40) = auVar44._12_4_;
      *(undefined4 *)((long)plVar24 + lVar20 + 0x44) = auVar60._12_4_;
      puVar1 = (undefined8 *)((long)plVar24 + lVar21 * 2 + 0x40);
      *puVar1 = CONCAT44(uVar46,uVar25);
      puVar1[1] = CONCAT44(uVar55,uVar30);
      puVar1 = (undefined8 *)((long)plVar24 + lVar21 * 2 + 0x50);
      *puVar1 = auVar54._8_8_;
      puVar1[1] = auVar58._8_8_;
      puVar4 = (undefined4 *)((long)plVar24 + lVar21 * 2 + 0x60);
      *puVar4 = auVar26._8_4_;
      puVar4[1] = auVar47._8_4_;
      *(undefined8 *)(puVar4 + 2) = auVar33._0_8_;
      lVar20 = lVar21 * 2;
      *(int *)((long)plVar24 + lVar20 + 0x78) = auVar28._12_4_;
      *(int *)((long)plVar24 + lVar20 + 0x7c) = auVar48._12_4_;
      *(long *)((long)plVar24 + lVar20 + 0x78) = auVar33._8_8_;
      lVar21 = lVar21 + 0x80;
    } while (lVar21 != 0x400);
    lVar21 = 8;
    plVar24 = local_7b8;
    bVar18 = false;
  } while (bVar23);
  piVar22 = output + 4;
  plVar24 = local_838;
  lVar21 = 0;
  do {
    fdct8x16_new_sse2((__m128i *)(local_838 + lVar21 * 0x20),(__m128i *)(local_838 + lVar21 * 0x20),
                      '\f');
    bVar5 = piVar17[2];
    if ((char)bVar5 < '\0') {
      auVar27 = ZEXT416((uint)(1 << (~bVar5 & 0x1f)));
      auVar27 = pshuflw(auVar27,auVar27,0);
      auVar29._0_4_ = auVar27._0_4_;
      auVar29._4_4_ = auVar29._0_4_;
      auVar29._8_4_ = auVar29._0_4_;
      auVar29._12_4_ = auVar29._0_4_;
      auVar33 = ZEXT416((uint)-(int)(char)bVar5);
      lVar20 = 0;
      do {
        auVar27 = paddsw(*(undefined1 (*) [16])((long)plVar24 + lVar20),auVar29);
        auVar27 = psraw(auVar27,auVar33);
        *(undefined1 (*) [16])((long)plVar24 + lVar20) = auVar27;
        lVar20 = lVar20 + 0x10;
      } while (lVar20 != 0x100);
    }
    else if (bVar5 != 0) {
      lVar20 = 0;
      do {
        auVar33 = psllw(*(undefined1 (*) [16])((long)plVar24 + lVar20),
                        ZEXT416((uint)(int)(char)bVar5));
        *(undefined1 (*) [16])((long)plVar24 + lVar20) = auVar33;
        lVar20 = lVar20 + 0x10;
      } while (lVar20 != 0x100);
    }
    lVar20 = 0;
    do {
      psVar2 = (short *)((long)plVar24 + lVar20);
      sVar7 = psVar2[4];
      sVar8 = psVar2[5];
      sVar9 = psVar2[6];
      sVar10 = psVar2[7];
      auVar36._0_12_ = auVar33._0_12_;
      auVar36._12_2_ = auVar33._6_2_;
      auVar36._14_2_ = psVar2[3];
      auVar35._12_4_ = auVar36._12_4_;
      auVar35._0_10_ = auVar33._0_10_;
      auVar35._10_2_ = psVar2[2];
      auVar34._10_6_ = auVar35._10_6_;
      auVar34._0_8_ = auVar33._0_8_;
      auVar34._8_2_ = auVar33._4_2_;
      auVar16._4_8_ = auVar34._8_8_;
      auVar16._2_2_ = psVar2[1];
      auVar16._0_2_ = auVar33._2_2_;
      auVar33._0_4_ = (int)*psVar2;
      auVar33._4_4_ = auVar16._0_4_ >> 0x10;
      auVar33._8_4_ = auVar34._8_4_ >> 0x10;
      auVar33._12_4_ = auVar35._12_4_ >> 0x10;
      *(undefined1 (*) [16])(piVar22 + lVar20 * 2 + -4) = auVar33;
      piVar3 = piVar22 + lVar20 * 2;
      *piVar3 = (int)sVar7;
      piVar3[1] = (int)sVar8;
      piVar3[2] = (int)sVar9;
      piVar3[3] = (int)sVar10;
      lVar20 = lVar20 + 0x10;
    } while (lVar20 != 0x100);
    lVar21 = lVar21 + 1;
    plVar24 = plVar24 + 0x20;
    piVar22 = piVar22 + 8;
  } while (lVar21 != 4);
  return;
}

Assistant:

void av1_lowbd_fwd_txfm2d_16x64_sse2(const int16_t *input, int32_t *output,
                                     int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  (void)tx_type;
  assert(tx_type == DCT_DCT);
  const TX_SIZE tx_size = TX_16X64;
  __m128i buf0[64], buf1[128];
  const int8_t *shift = av1_fwd_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = tx_size_wide[tx_size];
  const int height = tx_size_high[tx_size];
  const transform_1d_sse2 col_txfm = av1_fdct8x64_new_sse2;
  const transform_1d_sse2 row_txfm = fdct8x16_new_sse2;
  const int width_div8 = (width >> 3);
  const int height_div8 = (height >> 3);

  for (int i = 0; i < width_div8; i++) {
    load_buffer_16bit_to_16bit(input + 8 * i, stride, buf0, height);
    round_shift_16bit(buf0, height, shift[0]);
    col_txfm(buf0, buf0, cos_bit_col);
    round_shift_16bit(buf0, height, shift[1]);
    for (int j = 0; j < height_div8; ++j) {
      transpose_16bit_8x8(buf0 + j * 8, buf1 + j * width + 8 * i);
    }
  }

  for (int i = 0; i < AOMMIN(4, height_div8); i++) {
    __m128i *buf = buf1 + width * i;
    row_txfm(buf, buf, cos_bit_row);
    round_shift_16bit(buf, width, shift[2]);
    store_buffer_16bit_to_32bit_w8(buf, output + 8 * i, 32, 16);
  }
}